

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O3

base_learner * GD::setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  size_t *psVar2;
  _func_float_gd_ptr_base_learner_ptr_example_ptr *p_Var3;
  undefined8 uVar4;
  long lVar5;
  double dVar6;
  _Head_base<0UL,_GD::gd_*,_false> _Var7;
  int iVar8;
  int iVar9;
  gd *pgVar10;
  option_group_definition *poVar11;
  typed_option<float> *ptVar12;
  typed_option<double> *ptVar13;
  typed_option<unsigned_long> *ptVar14;
  size_t sVar15;
  ostream *poVar16;
  code *pcVar17;
  uint64_t uVar18;
  ulong uVar19;
  learner<GD::gd,_example> *plVar20;
  vw_exception *this;
  uint32_t stride_shift;
  code *pcVar21;
  uint32_t *puVar22;
  bool bVar23;
  code *pcVar24;
  byte bVar25;
  options_i *this_00;
  bool bVar26;
  float fVar27;
  bool normalized;
  bool invariant;
  bool adax;
  bool adaptive;
  bool sgd;
  option_group_definition new_options;
  stringstream __msg;
  bool local_dad;
  bool local_dac;
  bool local_dab;
  bool local_daa;
  bool local_da9;
  free_ptr<GD::gd> local_da8;
  options_i *local_d98;
  string local_d90;
  string local_d70;
  undefined1 *local_d50 [2];
  undefined1 local_d40 [16];
  string local_d30;
  undefined1 *local_d10 [2];
  undefined1 local_d00 [16];
  string local_cf0;
  undefined1 *local_cd0 [2];
  undefined1 local_cc0 [16];
  string local_cb0;
  undefined1 *local_c90 [2];
  undefined1 local_c80 [16];
  string local_c70;
  undefined1 *local_c50 [2];
  undefined1 local_c40 [16];
  string local_c30;
  undefined1 *local_c10 [2];
  undefined1 local_c00 [16];
  string local_bf0;
  undefined1 *local_bd0;
  long local_bc8;
  undefined1 local_bc0 [16];
  option_group_definition local_bb0;
  undefined1 *local_b78 [2];
  undefined1 local_b68 [16];
  undefined1 *local_b58 [2];
  undefined1 local_b48 [16];
  string local_b38;
  undefined1 local_b18 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a80;
  undefined1 local_a78 [48];
  string local_a48 [88];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9e0;
  undefined1 local_8f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_868;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_858;
  undefined1 local_850 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7b8;
  undefined1 local_7b0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_728;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_718;
  typed_option<double> local_710;
  typed_option<double> local_670;
  typed_option<double> local_5d0;
  typed_option<double> local_530;
  typed_option<float> local_490;
  typed_option<float> local_3f0;
  typed_option<bool> local_350;
  typed_option<bool> local_2b0;
  typed_option<bool> local_210;
  typed_option<bool> local_170;
  typed_option<bool> local_d0;
  
  local_d98 = options;
  pgVar10 = calloc_or_throw<GD::gd>(1);
  pgVar10->total_weight = 0.0;
  pgVar10->no_win_counter = 0;
  pgVar10->early_stop_thres = 0;
  pgVar10->initial_constant = 0.0;
  pgVar10->neg_norm_power = 0.0;
  pgVar10->neg_power_t = 0.0;
  pgVar10->sparse_l2 = 0.0;
  *(undefined8 *)&pgVar10->update_multiplier = 0;
  pgVar10->predict = (_func_void_gd_ptr_base_learner_ptr_example_ptr *)0x0;
  pgVar10->learn = (_func_void_gd_ptr_base_learner_ptr_example_ptr *)0x0;
  pgVar10->update = (_func_void_gd_ptr_base_learner_ptr_example_ptr *)0x0;
  pgVar10->sensitivity = (_func_float_gd_ptr_base_learner_ptr_example_ptr *)0x0;
  pgVar10->multipredict =
       (_func_void_gd_ptr_base_learner_ptr_example_ptr_size_t_size_t_polyprediction_ptr_bool *)0x0;
  pgVar10->normalized = false;
  pgVar10->adaptive = false;
  pgVar10->adax = false;
  *(undefined5 *)&pgVar10->field_0x5b = 0;
  pgVar10->all = (vw *)0x0;
  local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<GD::gd>;
  local_da9 = false;
  local_daa = false;
  local_dab = false;
  local_dac = false;
  local_dad = false;
  local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl = pgVar10;
  local_bd0 = local_bc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_bd0,"Gradient Descent options","");
  local_bb0.m_name._M_dataplus._M_p = (pointer)&local_bb0.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_bb0,local_bd0,local_bd0 + local_bc8);
  local_bb0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_bb0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_bb0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_bd0 != local_bc0) {
    operator_delete(local_bd0);
  }
  local_bf0._M_dataplus._M_p = (pointer)&local_bf0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bf0,"sgd","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_a78,&local_bf0,&local_da9);
  local_c10[0] = local_c00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c10,"use regular stochastic gradient descent update.","");
  std::__cxx11::string::_M_assign(local_a48);
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_a78);
  poVar11 = VW::config::option_group_definition::add<bool>(&local_bb0,&local_d0);
  local_c30._M_dataplus._M_p = (pointer)&local_c30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c30,"adaptive","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_b18,&local_c30,&local_daa);
  local_c50[0] = local_c40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c50,"use adaptive, individual learning rates.","");
  std::__cxx11::string::_M_assign((string *)(local_b18 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_b18);
  poVar11 = VW::config::option_group_definition::add<bool>(poVar11,&local_170);
  local_c70._M_dataplus._M_p = (pointer)&local_c70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c70,"adax","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_7b0,&local_c70,&local_dab);
  local_c90[0] = local_c80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c90,"use adaptive learning rates with x^2 instead of g^2x^2","");
  std::__cxx11::string::_M_assign((string *)(local_7b0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_210,(typed_option<bool> *)local_7b0);
  poVar11 = VW::config::option_group_definition::add<bool>(poVar11,&local_210);
  local_cb0._M_dataplus._M_p = (pointer)&local_cb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb0,"invariant","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_850,&local_cb0,&local_dac);
  local_cd0[0] = local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cd0,"use safe/importance aware updates.","");
  std::__cxx11::string::_M_assign((string *)(local_850 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2b0,(typed_option<bool> *)local_850);
  poVar11 = VW::config::option_group_definition::add<bool>(poVar11,&local_2b0);
  local_cf0._M_dataplus._M_p = (pointer)&local_cf0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cf0,"normalized","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_8f0,&local_cf0,&local_dad);
  local_d10[0] = local_d00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d10,"use per feature normalized updates","");
  std::__cxx11::string::_M_assign((string *)(local_8f0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_350,(typed_option<bool> *)local_8f0);
  poVar11 = VW::config::option_group_definition::add<bool>(poVar11,&local_350);
  local_d30._M_dataplus._M_p = (pointer)&local_d30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d30,"sparse_l2","");
  VW::config::typed_option<float>::typed_option(&local_490,&local_d30,&pgVar10->sparse_l2);
  ptVar12 = VW::config::typed_option<float>::default_value(&local_490,0.0);
  local_d50[0] = local_d40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d50,"use per feature normalized updates","");
  std::__cxx11::string::_M_assign((string *)&(ptVar12->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_3f0,ptVar12);
  poVar11 = VW::config::option_group_definition::add<float>(poVar11,&local_3f0);
  local_d70._M_dataplus._M_p = (pointer)&local_d70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d70,"l1_state","");
  VW::config::typed_option<double>::typed_option(&local_5d0,&local_d70,&all->sd->gravity);
  local_5d0.super_base_option.m_keep = all->save_resume;
  ptVar13 = VW::config::typed_option<double>::default_value(&local_5d0,0.0);
  local_b58[0] = local_b48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b58,"use per feature normalized updates","");
  std::__cxx11::string::_M_assign((string *)&(ptVar13->super_base_option).m_help);
  VW::config::typed_option<double>::typed_option(&local_530,ptVar13);
  poVar11 = VW::config::option_group_definition::add<double>(poVar11,&local_530);
  local_d90._M_dataplus._M_p = (pointer)&local_d90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d90,"l2_state","");
  VW::config::typed_option<double>::typed_option(&local_710,&local_d90,&all->sd->contraction);
  local_710.super_base_option.m_keep = all->save_resume;
  ptVar13 = VW::config::typed_option<double>::default_value(&local_710,1.0);
  local_b78[0] = local_b68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b78,"use per feature normalized updates","");
  std::__cxx11::string::_M_assign((string *)&(ptVar13->super_base_option).m_help);
  VW::config::typed_option<double>::typed_option(&local_670,ptVar13);
  VW::config::option_group_definition::add<double>(poVar11,&local_670);
  local_670.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d2678;
  if (local_670.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_670.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_670.super_base_option);
  if (local_b78[0] != local_b68) {
    operator_delete(local_b78[0]);
  }
  local_710.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d2678;
  if (local_710.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_710.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_710.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d90._M_dataplus._M_p != &local_d90.field_2) {
    operator_delete(local_d90._M_dataplus._M_p);
  }
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d2678;
  if (local_530.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if (local_b58[0] != local_b48) {
    operator_delete(local_b58[0]);
  }
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d2678;
  if (local_5d0.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5d0.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d70._M_dataplus._M_p != &local_d70.field_2) {
    operator_delete(local_d70._M_dataplus._M_p);
  }
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d20d0;
  if (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if (local_d50[0] != local_d40) {
    operator_delete(local_d50[0]);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d20d0;
  if (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d30._M_dataplus._M_p != &local_d30.field_2) {
    operator_delete(local_d30._M_dataplus._M_p);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d2108;
  if (local_350.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_d10[0] != local_d00) {
    operator_delete(local_d10[0]);
  }
  local_8f0._0_8_ = &PTR__typed_option_002d2108;
  if (local_858._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_858._M_pi);
  }
  if (local_868._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_868._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_8f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cf0._M_dataplus._M_p != &local_cf0.field_2) {
    operator_delete(local_cf0._M_dataplus._M_p);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d2108;
  if (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_cd0[0] != local_cc0) {
    operator_delete(local_cd0[0]);
  }
  local_850._0_8_ = &PTR__typed_option_002d2108;
  if (local_7b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7b8._M_pi);
  }
  if (local_7c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_850);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb0._M_dataplus._M_p != &local_cb0.field_2) {
    operator_delete(local_cb0._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d2108;
  if (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_c90[0] != local_c80) {
    operator_delete(local_c90[0]);
  }
  local_7b0._0_8_ = &PTR__typed_option_002d2108;
  if (local_718._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_718._M_pi);
  }
  if (local_728._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_728._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_7b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c70._M_dataplus._M_p != &local_c70.field_2) {
    operator_delete(local_c70._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d2108;
  if (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_c50[0] != local_c40) {
    operator_delete(local_c50[0]);
  }
  local_b18._0_8_ = &PTR__typed_option_002d2108;
  if (local_a80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a80._M_pi);
  }
  if (local_a90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a90._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_b18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c30._M_dataplus._M_p != &local_c30.field_2) {
    operator_delete(local_c30._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d2108;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_c10[0] != local_c00) {
    operator_delete(local_c10[0]);
  }
  local_a78._0_8_ = &PTR__typed_option_002d2108;
  if (local_9e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9e0._M_pi);
  }
  if (local_9f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9f0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf0._M_dataplus._M_p != &local_bf0.field_2) {
    operator_delete(local_bf0._M_dataplus._M_p);
  }
  this_00 = local_d98;
  (**local_d98->_vptr_options_i)(local_d98,&local_bb0);
  pgVar10->all = all;
  all->normalized_sum_norm_x = 0.0;
  pgVar10->total_weight = 0.0;
  pgVar10->no_win_counter = 0;
  fVar27 = -1.0;
  if (all->adaptive != false) {
    fVar27 = all->power_t + -1.0;
  }
  pgVar10->neg_norm_power = fVar27;
  pgVar10->neg_power_t = -all->power_t;
  pgVar10->adaptive = all->adaptive;
  pgVar10->normalized = all->normalized_updates;
  if (0.0 < all->initial_t) {
    pgVar10->all->normalized_sum_norm_x = (double)all->initial_t;
    pgVar10->total_weight = (double)all->initial_t;
  }
  pp_Var1 = (_func_int **)(local_a78 + 0x10);
  local_a78._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"feature_mask","");
  iVar8 = (*this_00->_vptr_options_i[1])(this_00,local_a78);
  if ((_func_int **)local_a78._0_8_ != pp_Var1) {
    operator_delete((void *)local_a78._0_8_);
  }
  if (all->holdout_set_off == false) {
    all->sd->holdout_best_loss = 3.4028234663852886e+38;
    local_a78._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"early_terminate","");
    ptVar14 = VW::config::options_i::get_typed_option<unsigned_long>(this_00,(string *)local_a78);
    psVar2 = (ptVar14->m_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (psVar2 == (size_t *)0x0) {
      sVar15 = 0;
    }
    else {
      sVar15 = *psVar2;
    }
    pgVar10->early_stop_thres = sVar15;
    if ((_func_int **)local_a78._0_8_ != pp_Var1) {
      operator_delete((void *)local_a78._0_8_);
    }
  }
  pgVar10->initial_constant = all->initial_constant;
  if ((((local_da9 == true) || ((local_daa & 1U) != 0)) || ((local_dac & 1U) != 0)) ||
     (local_dad == true)) {
    bVar26 = all->training == false;
    bVar23 = local_daa;
    if (bVar26) {
      bVar23 = false;
    }
    all->adaptive = bVar23;
    bVar23 = local_dac;
    if (bVar26) {
      bVar23 = false;
    }
    all->invariant_updates = bVar23;
    bVar23 = local_dad;
    if (bVar26) {
      bVar23 = false;
    }
    all->normalized_updates = bVar23;
    local_a78._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"learning_rate","");
    iVar9 = (*this_00->_vptr_options_i[1])(this_00,local_a78);
    if ((char)iVar9 == '\0') {
      local_b18._0_8_ = local_b18 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b18,"l","");
      iVar9 = (*local_d98->_vptr_options_i[1])(local_d98,local_b18);
      bVar23 = all->normalized_updates;
      bVar26 = all->adaptive;
      if ((undefined1 *)local_b18._0_8_ != local_b18 + 0x10) {
        operator_delete((void *)local_b18._0_8_);
      }
      bVar25 = ((byte)iVar9 | bVar23 & bVar26) ^ 1;
      this_00 = local_d98;
    }
    else {
      bVar25 = 0;
    }
    if ((_func_int **)local_a78._0_8_ != pp_Var1) {
      operator_delete((void *)local_a78._0_8_);
    }
    if ((bVar25 & 1) != 0) {
      all->eta = 10.0;
    }
    if ((all->adaptive == false) && (all->normalized_updates == false)) {
      local_a78._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"initial_t","");
      iVar9 = (*this_00->_vptr_options_i[1])(this_00,local_a78);
      if ((_func_int **)local_a78._0_8_ != pp_Var1) {
        operator_delete((void *)local_a78._0_8_);
      }
      if ((char)iVar9 == '\0') {
        all->sd->t = 1.0;
        all->initial_t = 1.0;
      }
      fVar27 = powf((float)all->sd->t,all->power_t);
      all->eta = fVar27 * all->eta;
    }
  }
  else {
    bVar23 = all->training;
    all->adaptive = bVar23;
    all->invariant_updates = bVar23;
    all->normalized_updates = bVar23;
  }
  if (local_dab == false) {
    bVar25 = pgVar10->adax;
  }
  else {
    bVar25 = all->training;
    pgVar10->adax = (bool)bVar25;
  }
  if (((bVar25 & 1) != 0) && (all->adaptive == false)) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_a78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a78 + 0x10),"Cannot use adax without adaptive",0x20);
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd.cc"
               ,0x48e,&local_b38);
    __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  dVar6 = pow((double)all->eta_decay_rate,
              ((double)CONCAT44(0x45300000,(int)(all->numpasses >> 0x20)) - 1.9342813113834067e+25)
              + ((double)CONCAT44(0x43300000,(int)all->numpasses) - 4503599627370496.0));
  if (dVar6 < 0.0001) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&(all->trace_message).super_ostream,
               "Warning: the learning rate for the last pass is multiplied by: ",0x3f);
    dVar6 = pow((double)all->eta_decay_rate,
                ((double)CONCAT44(0x45300000,(int)(all->numpasses >> 0x20)) - 1.9342813113834067e+25
                ) + ((double)CONCAT44(0x43300000,(int)all->numpasses) - 4503599627370496.0));
    poVar16 = std::ostream::_M_insert<double>(dVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16," adjust --decay_learning_rate larger to avoid this.",0x33);
    std::ios::widen((char)poVar16->_vptr_basic_ostream[-3] + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
  }
  if ((all->reg_mode & 1) == 0) {
    if (all->audit != false) {
      pcVar21 = multipredict<false,true>;
      pcVar17 = predict<false,true>;
      goto LAB_001639ba;
    }
    pcVar17 = predict<false,false>;
    bVar23 = all->hash_inv == false;
    if (!bVar23) {
      pcVar17 = predict<false,true>;
    }
    pcVar24 = multipredict<false,true>;
    pcVar21 = multipredict<false,false>;
  }
  else {
    if (all->audit != false) {
      pcVar21 = multipredict<true,true>;
      pcVar17 = predict<true,true>;
      goto LAB_001639ba;
    }
    pcVar17 = predict<true,false>;
    bVar23 = all->hash_inv == false;
    if (!bVar23) {
      pcVar17 = predict<true,true>;
    }
    pcVar24 = multipredict<true,true>;
    pcVar21 = multipredict<true,false>;
  }
  if (!bVar23) {
    pcVar21 = pcVar24;
  }
LAB_001639ba:
  bVar23 = (bool)((byte)iVar8 ^ 1);
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->predict = pcVar17;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->multipredict = pcVar21;
  if ((all->power_t != 0.5) || (NAN(all->power_t))) {
    uVar18 = set_learn<false>(all,bVar23,
                              local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                              super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                              super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl);
  }
  else {
    uVar18 = set_learn<true>(all,bVar23,
                             local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                             super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                             super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl);
  }
  uVar19 = uVar18 - 1;
  lVar5 = 0x3f;
  if (uVar19 != 0) {
    for (; uVar19 >> lVar5 == 0; lVar5 = lVar5 + -1) {
    }
  }
  stride_shift = 0;
  if (uVar19 != 0) {
    stride_shift = ((uint)lVar5 ^ 0xffffffc0) + 0x41;
  }
  if ((all->weights).sparse == true) {
    sparse_parameters::stride_shift(&(all->weights).sparse_weights,stride_shift);
    puVar22 = &(all->weights).dense_weights._stride_shift;
    if (((all->weights).sparse & 1U) != 0) {
      puVar22 = &(all->weights).sparse_weights._stride_shift;
    }
    stride_shift = *puVar22;
  }
  else {
    (all->weights).dense_weights._stride_shift = stride_shift;
  }
  _Var7._M_head_impl =
       local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
       _M_head_impl;
  plVar20 = LEARNER::init_learner<GD::gd,example,LEARNER::learner<char,char>>
                      (&local_da8,
                       (_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr *)
                       (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl)->learn,
                       (_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr *)
                       (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl)->predict,
                       1L << ((byte)stride_shift & 0x3f));
  p_Var3 = (_Var7._M_head_impl)->sensitivity;
  uVar4 = *(undefined8 *)(plVar20 + 0x18);
  *(undefined8 *)(plVar20 + 0x48) = uVar4;
  *(_func_float_gd_ptr_base_learner_ptr_example_ptr **)(plVar20 + 0x50) = p_Var3;
  *(_func_void_gd_ptr_base_learner_ptr_example_ptr_size_t_size_t_polyprediction_ptr_bool **)
   (plVar20 + 0x40) = (_Var7._M_head_impl)->multipredict;
  *(_func_void_gd_ptr_base_learner_ptr_example_ptr **)(plVar20 + 0x38) =
       (_Var7._M_head_impl)->update;
  *(code **)(plVar20 + 0x80) = save_load;
  *(undefined8 *)(plVar20 + 0x70) = uVar4;
  *(undefined8 *)(plVar20 + 0x78) = *(undefined8 *)(plVar20 + 0x20);
  *(undefined8 *)(plVar20 + 0x88) = uVar4;
  *(undefined8 *)(plVar20 + 0x90) = *(undefined8 *)(plVar20 + 0x20);
  *(code **)(plVar20 + 0x98) = end_pass;
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_bb0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bb0.m_name._M_dataplus._M_p != &local_bb0.m_name.field_2) {
    operator_delete(local_bb0.m_name._M_dataplus._M_p);
  }
  if (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
      _M_head_impl != (gd *)0x0) {
    (*(code *)local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl);
  }
  return (base_learner *)plVar20;
}

Assistant:

base_learner* setup(options_i& options, vw& all)
{
  auto g = scoped_calloc_or_throw<gd>();

  bool sgd = false;
  bool adaptive = false;
  bool adax = false;
  bool invariant = false;
  bool normalized = false;

  option_group_definition new_options("Gradient Descent options");
  new_options.add(make_option("sgd", sgd).help("use regular stochastic gradient descent update."))
      .add(make_option("adaptive", adaptive).help("use adaptive, individual learning rates."))
      .add(make_option("adax", adax).help("use adaptive learning rates with x^2 instead of g^2x^2"))
      .add(make_option("invariant", invariant).help("use safe/importance aware updates."))
      .add(make_option("normalized", normalized).help("use per feature normalized updates"))
      .add(make_option("sparse_l2", g->sparse_l2).default_value(0.f).help("use per feature normalized updates"))
      .add(make_option("l1_state", all.sd->gravity)
               .keep(all.save_resume)
               .default_value(0.)
               .help("use per feature normalized updates"))
      .add(make_option("l2_state", all.sd->contraction)
               .keep(all.save_resume)
               .default_value(1.)
               .help("use per feature normalized updates"));
  options.add_and_parse(new_options);

  g->all = &all;
  g->all->normalized_sum_norm_x = 0;
  g->no_win_counter = 0;
  g->total_weight = 0.;
  g->neg_norm_power = (all.adaptive ? (all.power_t - 1.f) : -1.f);
  g->neg_power_t = -all.power_t;
  g->adaptive = all.adaptive;
  g->normalized = all.normalized_updates;

  if (all.initial_t > 0)  // for the normalized update: if initial_t is bigger than 1 we interpret this as if we had
                          // seen (all.initial_t) previous fake datapoints all with norm 1
  {
    g->all->normalized_sum_norm_x = all.initial_t;
    g->total_weight = all.initial_t;
  }

  bool feature_mask_off = true;
  if (options.was_supplied("feature_mask"))
    feature_mask_off = false;

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    g->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  g->initial_constant = all.initial_constant;

  if (sgd || adaptive || invariant || normalized)
  {
    // nondefault
    all.adaptive = all.training && adaptive;
    all.invariant_updates = all.training && invariant;
    all.normalized_updates = all.training && normalized;

    if (!options.was_supplied("learning_rate") && !options.was_supplied("l") &&
        !(all.adaptive && all.normalized_updates))
      all.eta = 10;  // default learning rate to 10 for non default update rule

    // if not using normalized or adaptive, default initial_t to 1 instead of 0
    if (!all.adaptive && !all.normalized_updates)
    {
      if (!options.was_supplied("initial_t"))
      {
        all.sd->t = 1.f;
        all.initial_t = 1.f;
      }
      all.eta *= powf((float)(all.sd->t), all.power_t);
    }
  }
  else
  {
    all.adaptive = all.training;
    all.invariant_updates = all.training;
    all.normalized_updates = all.training;
  }

  if (adax)
    g->adax = all.training && adax;

  if (g->adax && !all.adaptive)
    THROW("Cannot use adax without adaptive");

  if (pow((double)all.eta_decay_rate, (double)all.numpasses) < 0.0001)
    all.trace_message << "Warning: the learning rate for the last pass is multiplied by: "
                      << pow((double)all.eta_decay_rate, (double)all.numpasses)
                      << " adjust --decay_learning_rate larger to avoid this." << endl;

  if (all.reg_mode % 2)
    if (all.audit || all.hash_inv)
    {
      g->predict = predict<true, true>;
      g->multipredict = multipredict<true, true>;
    }
    else
    {
      g->predict = predict<true, false>;
      g->multipredict = multipredict<true, false>;
    }
  else if (all.audit || all.hash_inv)
  {
    g->predict = predict<false, true>;
    g->multipredict = multipredict<false, true>;
  }
  else
  {
    g->predict = predict<false, false>;
    g->multipredict = multipredict<false, false>;
  }

  uint64_t stride;
  if (all.power_t == 0.5)
    stride = set_learn<true>(all, feature_mask_off, *g.get());
  else
    stride = set_learn<false>(all, feature_mask_off, *g.get());

  all.weights.stride_shift((uint32_t)ceil_log_2(stride - 1));

  gd* bare = g.get();
  learner<gd, example>& ret = init_learner(g, g->learn, bare->predict, ((uint64_t)1 << all.weights.stride_shift()));
  ret.set_sensitivity(bare->sensitivity);
  ret.set_multipredict(bare->multipredict);
  ret.set_update(bare->update);
  ret.set_save_load(save_load);
  ret.set_end_pass(end_pass);
  return make_base(ret);
}